

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_output.c
# Opt level: O0

void diff_output(diff_output_t *output,int side,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 local_34;
  va_list ap;
  char *fmt_local;
  int side_local;
  diff_output_t *output_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (output->verbose != 0) {
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    ap[0].reg_save_area = fmt;
    ensure_header(output);
    if (output->file_name != (char *)0x0) {
      diff_output_file(output,' ',output->file_name,output->file_size,output->file_crc,
                       output->file_mtime);
      output->file_name = (char *)0x0;
    }
    printf("%c ",(ulong)(uint)side);
    ap[0].overflow_arg_area = local_e8;
    ap[0]._0_8_ = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x18;
    vprintf((char *)ap[0].reg_save_area,&local_38);
    printf("\n");
  }
  return;
}

Assistant:

void
diff_output(diff_output_t *output, int side, const char *fmt, ...) {
    va_list ap;

    if (!output->verbose) {
        return;
    }

    ensure_header(output);

    if (output->file_name != NULL) {
        diff_output_file(output, ' ', output->file_name, output->file_size, output->file_crc, output->file_mtime);
        output->file_name = NULL;
    }

    printf("%c ", side);
    va_start(ap, fmt);
    vprintf(fmt, ap);
    va_end(ap);
    printf("\n");
}